

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  char cVar2;
  long lVar3;
  pointer pbVar4;
  size_type __len1;
  pointer ppVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  size_t __len2;
  long lVar9;
  pointer args_00;
  long lVar10;
  pointer this;
  bool bVar11;
  iter __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  findstr f;
  ArgIterator __begin1;
  string excludepaths;
  iter __end5;
  undefined1 local_258 [32];
  pointer local_238;
  pointer local_228;
  uint local_20c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  findstr local_1e8;
  ulong local_188;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
  local_170;
  undefined1 local_148 [32];
  undefined2 local_128;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  fileenumerator local_98;
  iter local_78;
  
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_208.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.pattern._M_dataplus._M_p = (pointer)&local_1e8.pattern.field_2;
  local_1e8.matchcount = 0;
  local_1e8.searchtype = REGEX_SEARCH;
  local_1e8.matchword = false;
  local_1e8.matchbinary = false;
  local_1e8.matchcase = false;
  local_1e8.matchstart = false;
  local_1e8.firstmatch = false;
  local_1e8.pattern_is_hex = false;
  local_1e8.pattern_is_guid = false;
  local_1e8.verbose = 0;
  local_1e8.list_only = false;
  local_1e8.count_only = false;
  local_1e8.readcontinuous = false;
  local_1e8.use_sequential = false;
  local_1e8.maxfilesize = 0;
  local_1e8.nameprinted = false;
  local_1e8.pattern._M_string_length = 0;
  local_1e8.pattern.field_2._M_local_buf[0] = '\0';
  local_1e8.bytemasks.
  super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.bytemasks.
  super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.bytemasks.
  super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8 = &local_a8;
  local_b0 = 0;
  local_a8 = 0;
  local_148._12_4_ = 1;
  local_128._0_1_ = false;
  local_128._1_1_ = false;
  local_148._0_8_ = argv;
  local_148._8_4_ = argc;
  if (argc != 1) {
    local_148._16_8_ = argv[1];
    cVar2 = *(char *)local_148._16_8_;
    local_148._24_8_ = (char *)local_148._16_8_;
    while (cVar2 != '\0') {
      cVar2 = *(char *)(local_148._24_8_ + 1);
      local_148._24_8_ = (char *)(local_148._24_8_ + 1);
    }
    pcVar1 = local_258 + 0x10;
    local_188 = 0;
    do {
      iVar6 = ArgParser::ArgIterator::option((ArgIterator *)local_148);
      if (iVar6 < 0x53) {
        if (iVar6 < 0x31) {
          if (iVar6 == -1) {
            if (local_1e8.pattern._M_string_length != 0) {
              pcVar8 = ArgParser::ArgIterator::getstr((ArgIterator *)local_148);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_258,pcVar8,(allocator<char> *)&local_78);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_208,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_258);
              goto LAB_001080f0;
            }
            pcVar8 = ArgParser::ArgIterator::getstr((ArgIterator *)local_148);
            __len1 = local_1e8.pattern._M_string_length;
            __len2 = strlen(pcVar8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace(&local_1e8.pattern,0,__len1,pcVar8,__len2);
          }
          else if (iVar6 == 0) {
            local_258._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"-","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_208,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_258);
LAB_001080f0:
            if ((pointer)local_258._0_8_ != pcVar1) {
              operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
            }
          }
          else {
            if (iVar6 != 0x30) goto switchD_00107ff1_caseD_73;
            local_1e8.matchstart = true;
          }
        }
        else if (iVar6 < 0x4d) {
          if (iVar6 == 0x31) {
            local_1e8.firstmatch = true;
          }
          else {
            if (iVar6 != 0x49) goto switchD_00107ff1_caseD_73;
            local_1e8.matchcase = true;
          }
        }
        else if (iVar6 == 0x4d) {
          local_1e8.maxfilesize = ArgParser::ArgIterator::getint((ArgIterator *)local_148);
        }
        else {
          if (iVar6 != 0x51) goto switchD_00107ff1_caseD_73;
          local_1e8.use_sequential = true;
        }
      }
      else {
        switch(iVar6) {
        case 0x62:
          local_1e8.matchbinary = true;
          break;
        case 99:
          local_1e8.count_only = true;
          break;
        case 100:
        case 0x65:
        case 0x68:
        case 0x69:
        case 0x6a:
        case 0x6b:
switchD_00107ff1_caseD_73:
          usage();
          iVar6 = 1;
          goto LAB_0010891e;
        case 0x66:
          local_1e8.readcontinuous = true;
          break;
        case 0x67:
          local_1e8.pattern_is_guid = true;
          break;
        case 0x6c:
          local_1e8.list_only = true;
          break;
        default:
          if (iVar6 - 0x72U < 7) {
            switch(iVar6) {
            case 0x72:
              local_188 = CONCAT71((int7)((ulong)((long)&switchD_00107ff1::switchdataD_0013406c +
                                                 (long)(int)(&switchD_00107ff1::switchdataD_0013406c
                                                            )[iVar6 - 0x72U]) >> 8),1);
              break;
            default:
              goto switchD_00107ff1_caseD_73;
            case 0x76:
              iVar6 = ArgParser::ArgIterator::count((ArgIterator *)local_148);
              local_1e8.verbose = local_1e8.verbose + iVar6;
              break;
            case 0x77:
              local_1e8.matchword = true;
              break;
            case 0x78:
              local_1e8.pattern_is_hex = true;
            }
          }
          else {
            if (iVar6 != 0x53) goto switchD_00107ff1_caseD_73;
            pcVar8 = ArgParser::ArgIterator::getstr((ArgIterator *)local_148);
            local_258._8_8_ = (pointer)0x5;
            local_258._16_6_ = 0x7865676572;
            local_258._0_8_ = pcVar1;
            iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_258,pcVar8);
            if ((pointer)local_258._0_8_ != pcVar1) {
              operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
            }
            if (iVar6 == 0) {
              local_1e8._28_8_ = local_1e8._28_8_ & 0xffffffff;
            }
            else {
              local_258._8_8_ = (pointer)0x3;
              local_258._16_4_ = 0x647473;
              local_258._0_8_ = pcVar1;
              iVar6 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_258,pcVar8);
              if ((pointer)local_258._0_8_ != pcVar1) {
                operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
              }
              if (iVar6 == 0) {
                local_1e8.searchtype = 1;
              }
              else {
                local_258._8_8_ = (pointer)0x5;
                local_258._16_6_ = 0x6d62647473;
                local_258._0_8_ = pcVar1;
                iVar6 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_258,pcVar8);
                if ((pointer)local_258._0_8_ != pcVar1) {
                  operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
                }
                if (iVar6 == 0) {
                  local_1e8.searchtype = 2;
                }
                else {
                  local_258._8_8_ = (pointer)0x6;
                  local_258._16_7_ = 0x686d62647473;
                  local_258._0_8_ = pcVar1;
                  iVar6 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_258,pcVar8);
                  if ((pointer)local_258._0_8_ != pcVar1) {
                    operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
                  }
                  if (iVar6 == 0) {
                    local_1e8.searchtype = 3;
                  }
                  else {
                    local_258._16_8_ = 0x6d6274736f6f62;
                    local_258._8_8_ = (pointer)0x7;
                    local_258._0_8_ = pcVar1;
                    iVar6 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_258,pcVar8);
                    if ((pointer)local_258._0_8_ != pcVar1) {
                      operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
                    }
                    if (iVar6 == 0) {
                      local_1e8.searchtype = 4;
                    }
                    else {
                      local_258._16_8_ = 0x686d6274736f6f62;
                      local_258._8_8_ = (pointer)0x8;
                      local_258[0x18] = '\0';
                      local_258._0_8_ = pcVar1;
                      iVar6 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_258,pcVar8);
                      if ((pointer)local_258._0_8_ != pcVar1) {
                        operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
                      }
                      if (iVar6 == 0) {
                        local_1e8.searchtype = 5;
                      }
                      else {
                        local_258._16_8_ = 0x706d6b74736f6f62;
                        local_258._8_8_ = (pointer)0x8;
                        local_258[0x18] = '\0';
                        local_258._0_8_ = pcVar1;
                        iVar6 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_258,pcVar8);
                        if ((pointer)local_258._0_8_ != pcVar1) {
                          operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
                        }
                        if (iVar6 == 0) {
                          local_1e8.searchtype = 6;
                        }
                        else {
                          local_258._8_8_ = (pointer)0x4;
                          local_258._16_5_ = 0x6b73616d;
                          local_258._0_8_ = pcVar1;
                          iVar6 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_258,pcVar8);
                          if ((pointer)local_258._0_8_ != pcVar1) {
                            operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
                          }
                          if (iVar6 == 0) {
                            local_1e8.searchtype = 7;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (local_148._12_4_ == local_148._8_4_) {
        bVar11 = (char *)local_148._16_8_ != (char *)0x0;
        iVar7 = local_148._12_4_;
      }
      else {
        iVar6 = local_148._12_4_ + 1;
        local_128._0_1_ = false;
        local_128._1_1_ = false;
        if (iVar6 == local_148._8_4_) {
          local_148._16_8_ = (char *)0x0;
          local_148._24_8_ = (char *)0x0;
          bVar11 = false;
          iVar7 = local_148._8_4_;
          local_148._12_4_ = iVar6;
        }
        else {
          local_148._16_8_ = *(undefined8 *)(local_148._0_8_ + (long)(int)local_148._12_4_ * 8 + 8);
          if (*(char *)local_148._16_8_ == '\0') {
            lVar9 = 0;
          }
          else {
            lVar10 = 0;
            do {
              lVar9 = lVar10 + 1;
              lVar3 = lVar10 + 1;
              lVar10 = lVar9;
            } while (*(char *)(local_148._16_8_ + lVar3) != '\0');
          }
          local_148._24_8_ = local_148._16_8_ + lVar9;
          bVar11 = true;
          iVar7 = iVar6;
          local_148._12_4_ = iVar6;
        }
      }
    } while ((iVar7 != argc) || (bVar11));
    if (local_1e8.pattern._M_string_length != 0) {
      if (local_1e8.pattern_is_hex == true) {
        local_1e8.matchbinary = true;
        local_1e8.matchcase = true;
      }
      if (local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_148._0_8_ = local_148 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"-","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_208,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148);
        if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
          operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
        }
      }
      bVar11 = findstr::compile_pattern(&local_1e8);
      iVar6 = 1;
      if (bVar11) {
        if (1 < local_1e8.verbose) {
          fprint<std::__cxx11::string&>(_stdout,"Compiled regex: %s\n",&local_1e8.pattern);
          ppVar5 = local_1e8.bytemasks.
                   super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (args_00 = local_1e8.bytemasks.
                         super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; args_00 != ppVar5;
              args_00 = args_00 + 1) {
            fprint<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                      (_stdout,"Compiled bytes: %-b\n",&args_00->first);
            fprint<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                      (_stdout,"Compiled  mask: %-b\n",&args_00->second);
          }
        }
        pbVar4 = local_208.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        iVar6 = 0;
        if (local_208.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_208.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          this = local_208.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          do {
            while( true ) {
              iVar6 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (this,"-");
              if (iVar6 != 0) break;
              findstr::searchstdin(&local_1e8);
LAB_00108811:
              this = this + 1;
              if (this == pbVar4) goto LAB_001089af;
            }
            iVar6 = stat((this->_M_dataplus)._M_p,(stat *)local_148);
            if (iVar6 == -1) goto LAB_00108811;
            if ((local_148._24_4_ & 0xf000) != 0x4000) {
              findstr::searchfile(&local_1e8,this);
              goto LAB_00108811;
            }
            if ((local_188 & 1) == 0) goto LAB_00108811;
            fileenumerator::fileenumerator(&local_98,this,1,SINGLE);
            fileenumerator::begin((iter *)local_258,&local_98);
            local_78.path._v.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            local_78._20_8_ = 0;
            local_78.path._v.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_78.path._v.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
            local_78.path._v.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
            local_78.stack.super__Vector_base<__dirstream_*,_std::allocator<__dirstream_*>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_78.cur.ent = (dirent *)0x0;
            local_78.stack.super__Vector_base<__dirstream_*,_std::allocator<__dirstream_*>_>._M_impl
            .super__Vector_impl_data._M_start = (pointer)0x0;
            local_78.stack.super__Vector_base<__dirstream_*,_std::allocator<__dirstream_*>_>._M_impl
            .super__Vector_impl_data._M_finish = (pointer)0x0;
            local_20c = 0;
            while (bVar11 = fileenumerator::iter::operator!=((iter *)local_258,&local_78), bVar11) {
              fileenumerator::iter::operator*[abi_cxx11_(&local_170,(iter *)local_258);
              findstr::searchfile(&local_1e8,
                                  &local_170.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                   ._M_head_impl);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl._M_dataplus._M_p !=
                  &local_170.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl.field_2) {
                operator_delete(local_170.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                ._M_head_impl._M_dataplus._M_p,
                                local_170.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                ._M_head_impl.field_2._M_allocated_capacity + 1);
              }
              fileenumerator::iter::nextent((iter *)local_258);
            }
            if (local_78.stack.super__Vector_base<__dirstream_*,_std::allocator<__dirstream_*>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_78.stack.
                              super__Vector_base<__dirstream_*,_std::allocator<__dirstream_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_78.stack.
                                    super__Vector_base<__dirstream_*,_std::allocator<__dirstream_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_78.stack.
                                    super__Vector_base<__dirstream_*,_std::allocator<__dirstream_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_78);
            if (local_238 != (pointer)0x0) {
              operator_delete(local_238,(long)local_228 - (long)local_238);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_258);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_98);
            this = this + 1;
          } while ((local_20c & 1) == 0 && this != pbVar4);
LAB_001089af:
          iVar6 = 0;
        }
      }
      goto LAB_0010891e;
    }
  }
  iVar6 = 1;
  usage();
LAB_0010891e:
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  std::
  vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~vector(&local_1e8.bytemasks);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.pattern._M_dataplus._M_p != &local_1e8.pattern.field_2) {
    operator_delete(local_1e8.pattern._M_dataplus._M_p,
                    CONCAT71(local_1e8.pattern.field_2._M_allocated_capacity._1_7_,
                             local_1e8.pattern.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  return iVar6;
}

Assistant:

int main(int argc, char** argv)
{
    bool recurse_dirs = false;
    std::vector<std::string> args;
    findstr  f;
    std::string excludepaths;

    for (auto& arg : ArgParser(argc, argv))
        switch (arg.option())
        {
            case 'w': f.matchword = true; break;
            case 'b': f.matchbinary = true; break;
            case 'I': f.matchcase = true; break;
            case '0': f.matchstart = true; break;
            case '1': f.firstmatch = true; break;
            case 'x': f.pattern_is_hex = true; break;
            case 'g': f.pattern_is_guid = true; break;
            case 'v': f.verbose += arg.count(); break;
            case 'r': recurse_dirs = true; break;
            case 'l': f.list_only = true; break;
            case 'c': f.count_only = true; break;
            case 'f': f.readcontinuous = true; break;
            case 'M': f.maxfilesize = arg.getint(); break;
            //case 'X': excludepaths = arg.getstr(); break;
#ifdef WITH_MEMSEARCH
            case 'o': f.memoffset = arg.getint(); break;
            case 'L': f.memsize = arg.getint(); break;
            case 'h': f.pid = arg.getint(); break;
#endif
            case 'S': 
                      {
                      auto mode = arg.getstr();
                      if (mode == "regex"s) f.searchtype = REGEX_SEARCH;
                      else if (mode == "std"s) f.searchtype = STD_SEARCH;
                      else if (mode == "stdbm"s) f.searchtype = STD_BOYER_MOORE;
                      else if (mode == "stdbmh"s) f.searchtype = STD_BOYER_MOORE_HORSPOOL;
                      else if (mode == "boostbm"s) f.searchtype = BOOST_BOYER_MOORE;
                      else if (mode == "boostbmh"s) f.searchtype = BOOST_BOYER_MOORE_HORSPOOL;
                      else if (mode == "boostkmp"s) f.searchtype = BOOST_KNUTH_MORRIS_PRATT;
                      else if (mode == "mask"s) f.searchtype = BYTEMASK_SEARCH;
                      }
                      break;
            case 'Q': f.use_sequential = true; break;
            case 0:
                      args.push_back("-");
                      break;
            case -1:
                if (f.pattern.empty()) 
                    f.pattern = arg.getstr();
                else {
                    args.push_back(arg.getstr());
                }
                break;
            default:
                usage();
                return 1;
        }

    if (f.pattern.empty()) {
        usage();
        return 1;
    }
    if (f.pattern_is_hex) {
        f.matchbinary = true;
        f.matchcase = true;
    }
    //std::set<std::string> exclude;
    //for (auto i : tokenize(excludepaths, ':'))
    //    exclude.insert(i);

#ifdef WITH_MEMSEARCH
    if (!f.memoffset)
#endif
    if (args.empty())
        args.push_back("-");
    if (!f.compile_pattern())
        return 1;
    if (f.verbose > 1) {
        print("Compiled regex: %s\n", f.pattern);
        for (auto & bm : f.bytemasks) {
            print("Compiled bytes: %-b\n", bm.first);
            print("Compiled  mask: %-b\n", bm.second);
        }
    }
    bool stop = false;
#ifdef WITH_MEMSEARCH
    if (f.memoffset)
        catchall(f.searchmemory(), "memory");
#endif
    if (stop)
        return 0;

    for (auto const& arg : args) {
        if (arg == "-")
            f.searchstdin();
        else {
            struct stat st;
            if (-1 == stat(arg.c_str(), &st))
                continue;

            if ((st.st_mode & S_IFMT) == S_IFDIR) {
                if (recurse_dirs)
                    for (auto [fn, ent] : fileenumerator(arg))
                        catchall(f.searchfile(fn), fn);
            }
            //      [recurse_dirs,&exclude](const std::string& fn)->bool { 
            //          return exclude.find(fn)==exclude.end() && recurse_dirs;
            //      }
            else {
                catchall(f.searchfile(arg), arg);
            }
        }

        if (stop)
            return 0;
    }

    return 0;
}